

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_handle.c
# Opt level: O2

uint32_t skynet_handle_findname(char *name)

{
  int *piVar1;
  handle_name *phVar2;
  handle_storage *phVar3;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  
  phVar3 = H;
  rwlock_rlock(&H->lock);
  iVar6 = phVar3->name_count + -1;
  iVar8 = 0;
  do {
    if (iVar6 < iVar8) {
      uVar5 = 0;
LAB_001128c0:
      LOCK();
      piVar1 = &(phVar3->lock).read;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      return uVar5;
    }
    uVar7 = (uint)(iVar8 + iVar6) >> 1;
    phVar2 = phVar3->name;
    iVar4 = strcmp(phVar2[uVar7].name,name);
    if (iVar4 == 0) {
      uVar5 = phVar2[uVar7].handle;
      goto LAB_001128c0;
    }
    if (iVar4 < 0) {
      iVar8 = uVar7 + 1;
    }
    else {
      iVar6 = uVar7 - 1;
    }
  } while( true );
}

Assistant:

uint32_t 
skynet_handle_findname(const char * name) {
	struct handle_storage *s = H;

	rwlock_rlock(&s->lock);

	uint32_t handle = 0;

	int begin = 0;
	int end = s->name_count - 1;
	while (begin<=end) {
		int mid = (begin+end)/2;
		struct handle_name *n = &s->name[mid];
		int c = strcmp(n->name, name);
		if (c==0) {
			handle = n->handle;
			break;
		}
		if (c<0) {
			begin = mid + 1;
		} else {
			end = mid - 1;
		}
	}

	rwlock_runlock(&s->lock);

	return handle;
}